

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_parser.hpp
# Opt level: O0

bool __thiscall
chaiscript::parser::
ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
::read_exponent_and_suffix
          (ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
           *this)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  bool local_42;
  bool local_41;
  undefined1 local_38 [8];
  Position exponent_pos;
  ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
  *this_local;
  
  exponent_pos._24_8_ = this;
  bVar1 = Position::has_more(&this->m_position);
  if (bVar1) {
    pcVar3 = Position::operator*(&this->m_position);
    iVar2 = tolower((int)*pcVar3);
    if (iVar2 == 0x65) {
      Position::operator++(&this->m_position);
      bVar1 = Position::has_more(&this->m_position);
      if ((bVar1) &&
         ((pcVar3 = Position::operator*(&this->m_position), *pcVar3 == '-' ||
          (pcVar3 = Position::operator*(&this->m_position), *pcVar3 == '+')))) {
        Position::operator++(&this->m_position);
      }
      local_38._0_4_ = (this->m_position).line;
      local_38._4_4_ = (this->m_position).col;
      exponent_pos._0_8_ = (this->m_position).m_pos;
      exponent_pos.m_pos = (this->m_position).m_end;
      exponent_pos.m_end = *(char **)&(this->m_position).m_last_col;
      while( true ) {
        bVar1 = Position::has_more(&this->m_position);
        local_41 = false;
        if (bVar1) {
          pcVar3 = Position::operator*(&this->m_position);
          local_41 = char_in_alphabet(this,*pcVar3,int_alphabet);
        }
        if (local_41 == false) break;
        Position::operator++(&this->m_position);
      }
      bVar1 = Position::operator==(&this->m_position,(Position *)local_38);
      if (bVar1) {
        return false;
      }
    }
  }
  while( true ) {
    bVar1 = Position::has_more(&this->m_position);
    local_42 = false;
    if (bVar1) {
      pcVar3 = Position::operator*(&this->m_position);
      local_42 = char_in_alphabet(this,*pcVar3,float_suffix_alphabet);
    }
    if (local_42 == false) break;
    Position::operator++(&this->m_position);
  }
  return true;
}

Assistant:

bool read_exponent_and_suffix() noexcept {
        // Support a form of scientific notation: 1e-5, 35.5E+8, 0.01e19
        if (m_position.has_more() && (std::tolower(*m_position) == 'e')) {
          ++m_position;
          if (m_position.has_more() && ((*m_position == '-') || (*m_position == '+'))) {
            ++m_position;
          }
          auto exponent_pos = m_position;
          while (m_position.has_more() && char_in_alphabet(*m_position, detail::int_alphabet)) {
            ++m_position;
          }
          if (m_position == exponent_pos) {
            // Require at least one digit after the exponent
            return false;
          }
        }

        // Parse optional float suffix
        while (m_position.has_more() && char_in_alphabet(*m_position, detail::float_suffix_alphabet)) {
          ++m_position;
        }

        return true;
      }